

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O0

bool google::protobuf::compiler::cpp::HasWeakFields(Descriptor *descriptor,Options *options)

{
  bool bVar1;
  int iVar2;
  FieldDescriptor *field;
  int local_24;
  int i;
  Options *options_local;
  Descriptor *descriptor_local;
  
  local_24 = 0;
  while( true ) {
    iVar2 = Descriptor::field_count(descriptor);
    if (iVar2 <= local_24) {
      return false;
    }
    field = Descriptor::field(descriptor,local_24);
    bVar1 = IsWeak(field,options);
    if (bVar1) break;
    local_24 = local_24 + 1;
  }
  return true;
}

Assistant:

bool HasWeakFields(const Descriptor* descriptor, const Options& options) {
  for (int i = 0; i < descriptor->field_count(); i++) {
    if (IsWeak(descriptor->field(i), options)) return true;
  }
  return false;
}